

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_message.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::MessageGenerator::GenerateDependentFieldAccessorDefinitions
          (MessageGenerator *this,Printer *printer)

{
  size_t field_00;
  bool bVar1;
  int iVar2;
  FieldOptions *this_00;
  mapped_type *pmVar3;
  OneofDescriptor *pOVar4;
  string *psVar5;
  char *pcVar6;
  FieldGenerator *pFVar7;
  int __c;
  int i_00;
  Descriptor *in_RDX;
  Descriptor *descriptor;
  allocator local_2a9;
  key_type local_2a8;
  string local_288 [39];
  allocator local_261;
  key_type local_260;
  string local_240 [39];
  allocator local_219;
  key_type local_218;
  string local_1f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  allocator local_1b1;
  key_type local_1b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_190;
  allocator local_159;
  key_type local_158;
  string local_138;
  allocator local_111;
  key_type local_110;
  allocator local_e9;
  key_type local_e8;
  string local_c8;
  allocator local_a1;
  key_type local_a0;
  undefined1 local_80 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  FieldDescriptor *field;
  int i;
  string local_38;
  Printer *local_18;
  Printer *printer_local;
  MessageGenerator *this_local;
  
  if ((this->use_dependent_base_ & 1U) != 0) {
    local_18 = printer;
    printer_local = (Printer *)this;
    DependentBaseClassTemplateName_abi_cxx11_(&local_38,(cpp *)this->descriptor_,in_RDX);
    io::Printer::Print(printer,"// $classname$\n\n","classname",&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    for (field._0_4_ = 0; iVar2 = Descriptor::field_count(this->descriptor_), (int)field < iVar2;
        field._0_4_ = (int)field + 1) {
      vars._M_t._M_impl.super__Rb_tree_header._M_node_count =
           (size_t)Descriptor::field(this->descriptor_,(int)field);
      this_00 = FieldDescriptor::options
                          ((FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      bVar1 = FieldOptions::weak(this_00);
      if (!bVar1) {
        anon_unknown_0::PrintFieldComment<google::protobuf::FieldDescriptor>
                  (local_18,(FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count
                  );
        if (((this->use_dependent_base_ & 1U) != 0) &&
           (bVar1 = IsFieldDependent((FieldDescriptor *)
                                     vars._M_t._M_impl.super__Rb_tree_header._M_node_count), bVar1))
        {
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)local_80);
          SetCommonFieldVariables
                    ((FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)local_80,&this->options_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_a0,"inline",&local_a1);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,&local_a0);
          std::__cxx11::string::operator=((string *)pmVar3,"inline ");
          std::__cxx11::string::~string((string *)&local_a0);
          std::allocator<char>::~allocator((allocator<char> *)&local_a1);
          pOVar4 = FieldDescriptor::containing_oneof
                             ((FieldDescriptor *)
                              vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
          if (pOVar4 == (OneofDescriptor *)0x0) {
            bVar1 = FieldDescriptor::is_repeated
                              ((FieldDescriptor *)
                               vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            field_00 = vars._M_t._M_impl.super__Rb_tree_header._M_node_count;
            if (!bVar1) {
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::map(&local_190,
                    (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     *)local_80);
              GenerateSingularFieldHasBits(this,(FieldDescriptor *)field_00,&local_190,local_18);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::~map(&local_190);
            }
          }
          else {
            psVar5 = FieldDescriptor::name_abi_cxx11_
                               ((FieldDescriptor *)
                                vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            UnderscoresToCamelCase(&local_c8,psVar5,true);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_e8,"field_name",&local_e9);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_80,&local_e8);
            std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_c8);
            std::__cxx11::string::~string((string *)&local_e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_e9);
            std::__cxx11::string::~string((string *)&local_c8);
            pOVar4 = FieldDescriptor::containing_oneof
                               ((FieldDescriptor *)
                                vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            psVar5 = OneofDescriptor::name_abi_cxx11_(pOVar4);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_110,"oneof_name",&local_111);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_80,&local_110);
            std::__cxx11::string::operator=((string *)pmVar3,(string *)psVar5);
            std::__cxx11::string::~string((string *)&local_110);
            std::allocator<char>::~allocator((allocator<char> *)&local_111);
            pOVar4 = FieldDescriptor::containing_oneof
                               ((FieldDescriptor *)
                                vars._M_t._M_impl.super__Rb_tree_header._M_node_count);
            pcVar6 = OneofDescriptor::index(pOVar4,(char *)psVar5,__c);
            SimpleItoa_abi_cxx11_(&local_138,(protobuf *)((ulong)pcVar6 & 0xffffffff),i_00);
            std::allocator<char>::allocator();
            std::__cxx11::string::string((string *)&local_158,"oneof_index",&local_159);
            pmVar3 = std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                     ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                   *)local_80,&local_158);
            std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_138);
            std::__cxx11::string::~string((string *)&local_158);
            std::allocator<char>::~allocator((allocator<char> *)&local_159);
            std::__cxx11::string::~string((string *)&local_138);
            GenerateOneofMemberHasBits
                      (this,(FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count
                       ,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_80,local_18);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_1b0,"tmpl",&local_1b1);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,&local_1b0);
          std::__cxx11::string::operator=((string *)pmVar3,"template<class T>\n");
          std::__cxx11::string::~string((string *)&local_1b0);
          std::allocator<char>::~allocator((allocator<char> *)&local_1b1);
          DependentBaseClassTemplateName_abi_cxx11_(&local_1f8,(cpp *)this->descriptor_,descriptor);
          std::operator+(&local_1d8,&local_1f8,"<T>");
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_218,"dependent_classname",&local_219);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,&local_218);
          std::__cxx11::string::operator=((string *)pmVar3,(string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_218);
          std::allocator<char>::~allocator((allocator<char> *)&local_219);
          std::__cxx11::string::~string((string *)&local_1d8);
          std::__cxx11::string::~string((string *)&local_1f8);
          DependentBaseDownCast_abi_cxx11_();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_260,"this_message",&local_261);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,&local_260);
          std::__cxx11::string::operator=((string *)pmVar3,local_240);
          std::__cxx11::string::~string((string *)&local_260);
          std::allocator<char>::~allocator((allocator<char> *)&local_261);
          std::__cxx11::string::~string(local_240);
          DependentBaseConstDownCast_abi_cxx11_();
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)&local_2a8,"this_const_message",&local_2a9);
          pmVar3 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 *)local_80,&local_2a8);
          std::__cxx11::string::operator=((string *)pmVar3,local_288);
          std::__cxx11::string::~string((string *)&local_2a8);
          std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
          std::__cxx11::string::~string(local_288);
          GenerateFieldClear(this,(FieldDescriptor *)
                                  vars._M_t._M_impl.super__Rb_tree_header._M_node_count,
                             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                              *)local_80,local_18);
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_80);
        }
        pFVar7 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)vars._M_t._M_impl.super__Rb_tree_header._M_node_count
                           );
        (*pFVar7->_vptr_FieldGenerator[6])(pFVar7,local_18);
        io::Printer::Print(local_18,"\n");
      }
    }
    GenerateOneofHasBits(this,local_18,true);
  }
  return;
}

Assistant:

void MessageGenerator::
GenerateDependentFieldAccessorDefinitions(io::Printer* printer) {
  if (!use_dependent_base_) return;

  printer->Print("// $classname$\n\n", "classname",
                 DependentBaseClassTemplateName(descriptor_));

  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);

    if (field->options().weak()) continue;

    PrintFieldComment(printer, field);

    // These functions are not really dependent: they are part of the
    // (non-dependent) derived class. However, they need to live outside
    // any #ifdef guards, so we treat them as if they were dependent.
    //
    // See the comment in FileGenerator::GenerateInlineFunctionDefinitions
    // for a more complete explanation.
    if (use_dependent_base_ && IsFieldDependent(field)) {
      std::map<string, string> vars;
      SetCommonFieldVariables(field, &vars, options_);
      vars["inline"] = "inline ";
      if (field->containing_oneof()) {
        vars["field_name"] = UnderscoresToCamelCase(field->name(), true);
        vars["oneof_name"] = field->containing_oneof()->name();
        vars["oneof_index"] = SimpleItoa(field->containing_oneof()->index());
        GenerateOneofMemberHasBits(field, vars, printer);
      } else if (!field->is_repeated()) {
        // There will be no header guard, so this always has to be inline.
        GenerateSingularFieldHasBits(field, vars, printer);
      }
      // vars needed for clear_(), which is in the dependent base:
      // (See also GenerateDependentFieldAccessorDeclarations.)
      vars["tmpl"] = "template<class T>\n";
      vars["dependent_classname"] =
          DependentBaseClassTemplateName(descriptor_) + "<T>";
      vars["this_message"] = DependentBaseDownCast();
      vars["this_const_message"] = DependentBaseConstDownCast();
      GenerateFieldClear(field, vars, printer);
    }

    // Generate type-specific accessors.
    field_generators_.get(field)
        .GenerateDependentInlineAccessorDefinitions(printer);

    printer->Print("\n");
  }

  // Generate has_$name$() and clear_has_$name$() functions for oneofs
  // Similar to other has-bits, these must always be in the header if we
  // are using a dependent base class.
  GenerateOneofHasBits(printer, true /* is_inline */);
}